

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V2_Annotation::IsValid(ON_OBSOLETE_V2_Annotation *this,ON_TextLog *text_log)

{
  V5_eAnnotationType VVar1;
  
  VVar1 = this->m_type;
  if (text_log != (ON_TextLog *)0x0 && VVar1 == dtNothing) {
    ON_TextLog::Print(text_log,
                      "ON_OBSOLETE_V2_Annotation has m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing.\n"
                     );
  }
  return VVar1 != dtNothing;
}

Assistant:

bool ON_OBSOLETE_V2_Annotation::IsValid( ON_TextLog* text_log ) const
{
  // TODO: quickly inspect object and return true/false
  bool rc = true;
  if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing == m_type  )
  {
    if ( 0 != text_log )
      text_log->Print("ON_OBSOLETE_V2_Annotation has m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing.\n");
    rc = false;
  }
  return rc;
}